

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveAsName(Parse *pParse,ExprList *pEList,Expr *pE)

{
  char *zRight;
  char *zLeft;
  int iVar1;
  char *zAs;
  char *zCol;
  int i;
  Expr *pE_local;
  ExprList *pEList_local;
  Parse *pParse_local;
  
  if (pE->op == '\x1b') {
    zRight = (pE->u).zToken;
    for (zCol._4_4_ = 0; zCol._4_4_ < pEList->nExpr; zCol._4_4_ = zCol._4_4_ + 1) {
      zLeft = pEList->a[zCol._4_4_].zName;
      if ((zLeft != (char *)0x0) && (iVar1 = sqlite3StrICmp(zLeft,zRight), iVar1 == 0)) {
        return zCol._4_4_ + 1;
      }
    }
  }
  return 0;
}

Assistant:

static int resolveAsName(
  Parse *pParse,     /* Parsing context for error messages */
  ExprList *pEList,  /* List of expressions to scan */
  Expr *pE           /* Expression we are trying to match */
){
  int i;             /* Loop counter */

  UNUSED_PARAMETER(pParse);

  if( pE->op==TK_ID ){
    char *zCol = pE->u.zToken;
    for(i=0; i<pEList->nExpr; i++){
      char *zAs = pEList->a[i].zName;
      if( zAs!=0 && sqlite3StrICmp(zAs, zCol)==0 ){
        return i+1;
      }
    }
  }
  return 0;
}